

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O2

void transpose_16bit_8x4(__m128i *in,__m128i *out)

{
  __m128i alVar1;
  __m128i alVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  undefined4 uVar5;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined4 uVar10;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar6 [12];
  undefined1 auVar7 [16];
  undefined1 auVar11 [12];
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  
  alVar1 = *in;
  alVar2 = in[2];
  auVar17._0_12_ = alVar1._0_12_;
  auVar17._12_2_ = alVar1[0]._6_2_;
  auVar17._14_2_ = *(undefined2 *)((long)in[1] + 6);
  auVar16._12_4_ = auVar17._12_4_;
  auVar16._0_10_ = alVar1._0_10_;
  auVar16._10_2_ = *(undefined2 *)((long)in[1] + 4);
  auVar15._10_6_ = auVar16._10_6_;
  auVar15._0_8_ = alVar1[0];
  auVar15._8_2_ = alVar1[0]._4_2_;
  auVar3._4_8_ = auVar15._8_8_;
  auVar3._2_2_ = *(undefined2 *)((long)in[1] + 2);
  auVar3._0_2_ = alVar1[0]._2_2_;
  auVar14._0_4_ = CONCAT22((short)in[1][0],(short)alVar1[0]);
  auVar14._4_12_ = auVar3;
  auVar21._0_12_ = alVar2._0_12_;
  auVar21._12_2_ = alVar2[0]._6_2_;
  auVar21._14_2_ = *(undefined2 *)((long)in[3] + 6);
  auVar20._12_4_ = auVar21._12_4_;
  auVar20._0_10_ = alVar2._0_10_;
  auVar20._10_2_ = *(undefined2 *)((long)in[3] + 4);
  auVar19._10_6_ = auVar20._10_6_;
  auVar19._0_8_ = alVar2[0];
  auVar19._8_2_ = alVar2[0]._4_2_;
  auVar4._4_8_ = auVar19._8_8_;
  auVar4._2_2_ = *(undefined2 *)((long)in[3] + 2);
  auVar4._0_2_ = alVar2[0]._2_2_;
  uVar5 = CONCAT22((short)in[1][1],(short)alVar1[1]);
  auVar6._0_8_ = CONCAT26(*(undefined2 *)((long)in[1] + 10),CONCAT24(alVar1[1]._2_2_,uVar5));
  auVar6._8_2_ = alVar1[1]._4_2_;
  auVar6._10_2_ = *(undefined2 *)((long)in[1] + 0xc);
  auVar7._12_2_ = alVar1[1]._6_2_;
  auVar7._0_12_ = auVar6;
  auVar7._14_2_ = *(undefined2 *)((long)in[1] + 0xe);
  uVar10 = CONCAT22((short)in[3][1],(short)alVar2[1]);
  auVar11._0_8_ = CONCAT26(*(undefined2 *)((long)in[3] + 10),CONCAT24(alVar2[1]._2_2_,uVar10));
  auVar11._8_2_ = alVar2[1]._4_2_;
  auVar11._10_2_ = *(undefined2 *)((long)in[3] + 0xc);
  auVar12._12_2_ = alVar2[1]._6_2_;
  auVar12._0_12_ = auVar11;
  auVar12._14_2_ = *(undefined2 *)((long)in[3] + 0xe);
  auVar9._0_8_ = auVar14._0_8_;
  auVar9._8_4_ = auVar3._0_4_;
  auVar9._12_4_ = auVar4._0_4_;
  auVar13._8_4_ = (int)((ulong)auVar6._0_8_ >> 0x20);
  auVar13._0_8_ = auVar6._0_8_;
  auVar13._12_4_ = (int)((ulong)auVar11._0_8_ >> 0x20);
  auVar18._0_8_ = CONCAT44(auVar19._8_4_,auVar15._8_4_);
  auVar18._8_4_ = auVar16._12_4_;
  auVar18._12_4_ = auVar20._12_4_;
  auVar8._0_8_ = CONCAT44(auVar11._8_4_,auVar6._8_4_);
  auVar8._8_4_ = auVar7._12_4_;
  auVar8._12_4_ = auVar12._12_4_;
  (*out)[0] = CONCAT44(CONCAT22((short)in[3][0],(short)alVar2[0]),auVar14._0_4_);
  (*out)[1] = 0;
  out[1][0] = auVar9._8_8_;
  out[1][1] = 0;
  out[2][0] = auVar18._0_8_;
  out[2][1] = 0;
  out[3] = (__m128i)(auVar18 >> 0x40);
  out[4][0] = CONCAT44(uVar10,uVar5);
  out[4][1] = 0;
  out[5][0] = auVar13._8_8_;
  out[5][1] = 0;
  out[6][0] = auVar8._0_8_;
  out[6][1] = 0;
  out[7] = (__m128i)(auVar8 >> 0x40);
  return;
}

Assistant:

static inline void transpose_16bit_8x4(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  04 05 06 07
  // in[1]: 10 11 12 13  14 15 16 17
  // in[2]: 20 21 22 23  24 25 26 27
  // in[3]: 30 31 32 33  34 35 36 37

  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  // a4:    04 14 05 15  06 16 07 17
  // a5:    24 34 25 35  26 36 27 37
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);
  const __m128i a4 = _mm_unpackhi_epi16(in[0], in[1]);
  const __m128i a5 = _mm_unpackhi_epi16(in[2], in[3]);

  // Unpack 32 bit elements resulting in:
  // b0: 00 10 20 30  01 11 21 31
  // b2: 04 14 24 34  05 15 25 35
  // b4: 02 12 22 32  03 13 23 33
  // b6: 06 16 26 36  07 17 27 37
  const __m128i b0 = _mm_unpacklo_epi32(a0, a1);
  const __m128i b2 = _mm_unpacklo_epi32(a4, a5);
  const __m128i b4 = _mm_unpackhi_epi32(a0, a1);
  const __m128i b6 = _mm_unpackhi_epi32(a4, a5);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30  XX XX XX XX
  // out[1]: 01 11 21 31  XX XX XX XX
  // out[2]: 02 12 22 32  XX XX XX XX
  // out[3]: 03 13 23 33  XX XX XX XX
  // out[4]: 04 14 24 34  XX XX XX XX
  // out[5]: 05 15 25 35  XX XX XX XX
  // out[6]: 06 16 26 36  XX XX XX XX
  // out[7]: 07 17 27 37  XX XX XX XX
  const __m128i zeros = _mm_setzero_si128();
  out[0] = _mm_unpacklo_epi64(b0, zeros);
  out[1] = _mm_unpackhi_epi64(b0, zeros);
  out[2] = _mm_unpacklo_epi64(b4, zeros);
  out[3] = _mm_unpackhi_epi64(b4, zeros);
  out[4] = _mm_unpacklo_epi64(b2, zeros);
  out[5] = _mm_unpackhi_epi64(b2, zeros);
  out[6] = _mm_unpacklo_epi64(b6, zeros);
  out[7] = _mm_unpackhi_epi64(b6, zeros);
}